

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.cpp
# Opt level: O3

void ximu::PacketEncoding::rightShiftBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  pointer puVar5;
  byte bVar6;
  
  puVar5 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar1 = puVar5 + -1;
  *pbVar1 = *pbVar1 >> 1;
  uVar3 = ((int)puVar5 - iVar2) - 2;
  if (-1 < (int)uVar3) {
    lVar4 = (ulong)uVar3 + 1;
    do {
      puVar5 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar6 = puVar5[lVar4 + -1];
      if ((bVar6 & 1) != 0) {
        puVar5[lVar4] = puVar5[lVar4] | 0x80;
        puVar5 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar6 = puVar5[lVar4 + -1];
      }
      puVar5[lVar4 + -1] = bVar6 >> 1;
      lVar4 = lVar4 + -1;
    } while (0 < (int)lVar4);
  }
  return;
}

Assistant:

void PacketEncoding::rightShiftBytes(std::vector<unsigned char>& v) {
  size_t size = v.size();
  v[size - 1] >>= 1;

  for (int idx = size - 2; idx >= 0; --idx) {
    if ((v[idx] & 0x01) == 0x01)
      v[idx + 1] |= 0x80;
    v[idx] >>= 1;
  }
}